

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::ComputePDBOutputDir
          (cmGeneratorTarget *this,string *kind,string *config,string *out)

{
  pointer pcVar1;
  size_type sVar2;
  cmGlobalGenerator *pcVar3;
  int iVar4;
  char *pcVar5;
  string *in_base;
  _Alloc_hider __s;
  _Alloc_hider __s_00;
  string local_120;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_e8 [16];
  string conf;
  string configPropStr;
  string propertyNameStr;
  string configUpper;
  cmListFileBacktrace local_58;
  cmListFileBacktrace local_48;
  
  propertyNameStr._M_dataplus._M_p = (pointer)&propertyNameStr.field_2;
  pcVar1 = (kind->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&propertyNameStr,pcVar1,pcVar1 + kind->_M_string_length);
  if (propertyNameStr._M_string_length == 0) {
    __s_00._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&propertyNameStr);
    __s_00 = propertyNameStr._M_dataplus;
  }
  conf._M_dataplus._M_p = (pointer)&conf.field_2;
  pcVar1 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&conf,pcVar1,pcVar1 + config->_M_string_length);
  cmsys::SystemTools::UpperCase(&configUpper,&conf);
  configPropStr._M_dataplus._M_p = (pointer)&configPropStr.field_2;
  pcVar1 = (kind->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&configPropStr,pcVar1,pcVar1 + kind->_M_string_length);
  if (configPropStr._M_string_length == 0) {
    __s._M_p = (char *)0x0;
  }
  else {
    std::__cxx11::string::append((char *)&configPropStr);
    std::__cxx11::string::_M_append((char *)&configPropStr,(ulong)configUpper._M_dataplus._M_p);
    __s = configPropStr._M_dataplus;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,__s._M_p,(allocator<char> *)&ge);
  pcVar5 = GetProperty(this,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_120.field_2._M_local_buf[1],
                                      local_120.field_2._M_local_buf[0])) + 1);
  }
  if (pcVar5 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,__s_00._M_p,(allocator<char> *)&ge);
    pcVar5 = GetProperty(this,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_120.field_2._M_local_buf[1],
                                        local_120.field_2._M_local_buf[0])) + 1);
    }
    if (pcVar5 == (char *)0x0) goto LAB_00344310;
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_58);
    if (local_58.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_58.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
               this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_120);
    std::__cxx11::string::_M_assign((string *)out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_120.field_2._M_local_buf[1],
                                        local_120.field_2._M_local_buf[0])) + 1);
    }
    iVar4 = std::__cxx11::string::compare((char *)out);
    if (iVar4 != 0) {
      conf._M_string_length = 0;
      *conf._M_dataplus._M_p = '\0';
    }
  }
  else {
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_48);
    if (local_48.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(char *)&ge);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    local_120._M_string_length = 0;
    local_120.field_2._M_local_buf[0] = '\0';
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,
               this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,&local_120);
    std::__cxx11::string::_M_assign((string *)out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_120.field_2._M_local_buf[1],
                                        local_120.field_2._M_local_buf[0])) + 1);
    }
    conf._M_string_length = 0;
    *conf._M_dataplus._M_p = '\0';
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
LAB_00344310:
  sVar2 = out->_M_string_length;
  if (sVar2 != 0) {
    in_base = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
    cmsys::SystemTools::CollapseFullPath(&local_120,out,in_base);
    std::__cxx11::string::operator=((string *)out,(string *)&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                               CONCAT11(local_120.field_2._M_local_buf[1],
                                        local_120.field_2._M_local_buf[0])) + 1);
    }
    if (conf._M_string_length != 0) {
      pcVar3 = this->LocalGenerator->GlobalGenerator;
      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
      local_120.field_2._M_local_buf[0] = '/';
      local_120.field_2._M_local_buf[1] = '\0';
      local_120._M_string_length = 1;
      ge.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e8[0] = 0;
      ge.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_e8;
      (*pcVar3->_vptr_cmGlobalGenerator[0x16])(pcVar3,&local_120,&conf,&ge,out);
      if (ge.Backtrace.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)local_e8) {
        operator_delete(ge.Backtrace.TopEntry.
                        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,CONCAT71(local_e8._1_7_,local_e8[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,
                        CONCAT62(local_120.field_2._M_allocated_capacity._2_6_,
                                 CONCAT11(local_120.field_2._M_local_buf[1],
                                          local_120.field_2._M_local_buf[0])) + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configPropStr._M_dataplus._M_p != &configPropStr.field_2) {
    operator_delete(configPropStr._M_dataplus._M_p,configPropStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configUpper._M_dataplus._M_p != &configUpper.field_2) {
    operator_delete(configUpper._M_dataplus._M_p,configUpper.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)conf._M_dataplus._M_p != &conf.field_2) {
    operator_delete(conf._M_dataplus._M_p,conf.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)propertyNameStr._M_dataplus._M_p != &propertyNameStr.field_2) {
    operator_delete(propertyNameStr._M_dataplus._M_p,
                    propertyNameStr.field_2._M_allocated_capacity + 1);
  }
  return sVar2 != 0;
}

Assistant:

bool cmGeneratorTarget::ComputePDBOutputDir(const std::string& kind,
                                            const std::string& config,
                                            std::string& out) const
{
  // Look for a target property defining the target output directory
  // based on the target type.
  const char* propertyName = nullptr;
  std::string propertyNameStr = kind;
  if (!propertyNameStr.empty()) {
    propertyNameStr += "_OUTPUT_DIRECTORY";
    propertyName = propertyNameStr.c_str();
  }
  std::string conf = config;

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(conf);
  const char* configProp = nullptr;
  std::string configPropStr = kind;
  if (!configPropStr.empty()) {
    configPropStr += "_OUTPUT_DIRECTORY_";
    configPropStr += configUpper;
    configProp = configPropStr.c_str();
  }

  // Select an output directory.
  if (const char* config_outdir = this->GetProperty(configProp)) {
    // Use the user-specified per-configuration output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(config_outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory.
    conf.clear();
  } else if (const char* outdir = this->GetProperty(propertyName)) {
    // Use the user-specified output directory.
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(outdir);
    out = cge->Evaluate(this->LocalGenerator, config);

    // Skip per-configuration subdirectory if the value contained a
    // generator expression.
    if (out != outdir) {
      conf.clear();
    }
  }
  if (out.empty()) {
    return false;
  }

  // Convert the output path to a full path in case it is
  // specified as a relative path.  Treat a relative path as
  // relative to the current output directory for this makefile.
  out = (cmSystemTools::CollapseFullPath(
    out, this->LocalGenerator->GetCurrentBinaryDirectory()));

  // The generator may add the configuration's subdirectory.
  if (!conf.empty()) {
    this->LocalGenerator->GetGlobalGenerator()->AppendDirectoryForConfig(
      "/", conf, "", out);
  }
  return true;
}